

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableGenerator.cpp
# Opt level: O2

void ShuffleDeck16_Ref(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  ulong uVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  *deck = 0;
  for (uVar3 = 1; uVar3 < count; uVar3 = uVar3 + 1) {
    uVar2 = siamese::PCGRandom::Next(prng);
    uVar1 = (ulong)uVar2 % (ulong)((int)uVar3 + 1);
    if (uVar3 != uVar1) {
      deck[uVar3] = deck[uVar1];
    }
    deck[uVar1] = (uint16_t)uVar3;
  }
  return;
}

Assistant:

void ShuffleDeck16_Ref(
    PCGRandom &prng,
    uint16_t * deck,
    const uint32_t count)
{
#if 1

    deck[0] = 0;

    for (unsigned i = 1; i < count; ++i)
    {
        unsigned j = prng.Next() % (i + 1);
        if (j != i) {
            deck[i] = deck[j];
        }
        deck[j] = (uint16_t)i;
    }

#else

    (void)prng;

    for (unsigned i = 0; i < count; ++i)
    {
        deck[i] = (uint16_t)i;
    }

    // This is even slower
    std::random_shuffle(&deck[0], &deck[count]);

#endif
}